

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_extract_to_cfile
                  (mz_zip_archive *pZip,mz_uint file_index,FILE *pFile,mz_uint flags)

{
  mz_bool mVar1;
  undefined1 local_490 [8];
  mz_zip_archive_file_stat file_stat;
  mz_uint flags_local;
  FILE *pFile_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  file_stat.m_comment._508_4_ = flags;
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)local_490);
  if (mVar1 == 0) {
    pZip_local._0_4_ = 0;
  }
  else if ((file_stat.m_local_header_ofs._4_4_ == 0) && (file_stat.m_is_directory != 0)) {
    pZip_local._0_4_ =
         mz_zip_reader_extract_to_callback
                   (pZip,file_index,mz_zip_file_write_callback,pFile,file_stat.m_comment._508_4_);
  }
  else {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    }
    pZip_local._0_4_ = 0;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_extract_to_cfile(mz_zip_archive *pZip, mz_uint file_index, MZ_FILE *pFile, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    if ((file_stat.m_is_directory) || (!file_stat.m_is_supported))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    return mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_file_write_callback, pFile, flags);
}